

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O2

void __thiscall SStringView_At_Test::~SStringView_At_Test(SStringView_At_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (SStringView, At) {
    std::string const src{"ABCDE"};
    pstore::sstring_view<char const *> sv = pstore::make_sstring_view (src.data (), src.length ());
    ASSERT_EQ (sv.length (), src.length ());
    EXPECT_FALSE (sv.empty ());
    EXPECT_EQ (sv.at (0), 'A');
    EXPECT_EQ (sv.at (1), 'B');
    EXPECT_EQ (sv.at (4), 'E');
#ifdef PSTORE_EXCEPTIONS
    EXPECT_THROW (sv.at (5), std::out_of_range);
#endif // PSTORE_EXCEPTIONS
}